

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O0

void __thiscall Sudoku::Sudoku(Sudoku *this,int seed)

{
  time_t tVar1;
  int seed_local;
  Sudoku *this_local;
  
  initPole(this);
  if (seed != -1) {
    if (seed == 0) {
      tVar1 = time((time_t *)0x0);
      srand((uint)tVar1);
    }
    else {
      srand(seed);
    }
    rekurzivniReseni(this);
    skryjNa30(this);
    restart(this);
  }
  return;
}

Assistant:

Sudoku::Sudoku( int seed )
{
  initPole();
  //stav temp;
  if (seed == -1) // prazdne puzzle
    return;
  if (seed == 0)// ciste nahodne puzzle
  {
    srand(time(0));
  }
  else// puzzle dane zadanou ciselnou hodnotou
  {
    srand(seed);
  }
  rekurzivniReseni(); // vyresime
  skryjNa30(); // nechame 30 odkrytych cisel tak, aby bylo mozne sudoku vyresit zakladnimi metodami
  restart(); // zrus vsechny ne-pevna cisla
}